

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

UBool icu_63::GreekUpper::isFollowedByCasedLetter(UChar *s,int32_t i,int32_t length)

{
  uint uVar1;
  int iVar2;
  int32_t type;
  uint16_t __c2;
  UChar32 c;
  int32_t length_local;
  int32_t i_local;
  UChar *s_local;
  
  c = i;
  do {
    if (length <= c) {
      return '\0';
    }
    iVar2 = c + 1;
    type = (int32_t)(ushort)s[c];
    if ((((type & 0xfffffc00U) == 0xd800) && (iVar2 != length)) && ((s[iVar2] & 0xfc00U) == 0xdc00))
    {
      type = type * 0x400 + (uint)(ushort)s[iVar2] + -0x35fdc00;
      iVar2 = c + 2;
    }
    c = iVar2;
    uVar1 = ucase_getTypeOrIgnorable_63(type);
  } while ((uVar1 & 4) != 0);
  return uVar1 != 0;
}

Assistant:

UBool isFollowedByCasedLetter(const UChar *s, int32_t i, int32_t length) {
    while (i < length) {
        UChar32 c;
        U16_NEXT(s, i, length, c);
        int32_t type = ucase_getTypeOrIgnorable(c);
        if ((type & UCASE_IGNORABLE) != 0) {
            // Case-ignorable, continue with the loop.
        } else if (type != UCASE_NONE) {
            return TRUE;  // Followed by cased letter.
        } else {
            return FALSE;  // Uncased and not case-ignorable.
        }
    }
    return FALSE;  // Not followed by cased letter.
}